

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iep2_test.c
# Opt level: O3

void iep2_test(iep2_test_cfg *cfg)

{
  int iVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  int iVar4;
  undefined4 uVar5;
  iep_com_ctx *piVar6;
  void *__ptr;
  void *__ptr_00;
  void *__ptr_01;
  size_t sVar7;
  char *pcVar8;
  RK_U32 len;
  size_t sVar9;
  ulong uVar10;
  int iVar11;
  size_t sVar12;
  undefined8 uVar13;
  uint uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  bool bVar18;
  undefined1 auVar19 [16];
  MppBufferGroup memGroup;
  MppBuffer dstbuf [2];
  MppBuffer srcbuf [3];
  RK_S32 fdsrc [3];
  RK_U8 *pdst [2];
  DataCrc checkcrc;
  RK_U8 *psrc [3];
  iep2_api_info dei_info;
  IepImg imgdst [2];
  IepImg imgsrc [3];
  long local_1d8;
  iep_com_ctx *local_1d0;
  undefined8 local_1c8;
  long local_1c0;
  int local_1b8;
  int iStack_1b4;
  int iStack_1b0;
  int iStack_1ac;
  undefined8 local_1a8;
  RK_S32 local_19c;
  RK_S32 local_198;
  RK_S32 local_194 [3];
  void *local_188 [3];
  ulong local_170;
  size_t local_168;
  size_t local_160;
  DataCrc local_158;
  ulong local_138;
  void *local_130;
  void *local_128;
  ulong local_120;
  void *local_118 [3];
  int local_fc [5];
  IepImg local_e8;
  IepImg local_cc;
  IepImg IStack_a8;
  RK_U32 local_80;
  RK_U32 local_64;
  undefined4 local_50;
  undefined4 uStack_4c;
  undefined4 uStack_48;
  undefined8 uStack_44;
  undefined8 local_3c;
  undefined4 local_34;
  
  piVar6 = (iep_com_ctx *)rockchip_iep2_api_alloc_ctx();
  iVar4 = cfg->w;
  iVar1 = cfg->h;
  if (cfg->src_fmt == 3) {
    iVar11 = (iVar1 * iVar4 * 3) / 2;
  }
  else {
    if (cfg->src_fmt != 2) goto LAB_00102bb9;
    iVar11 = iVar1 * iVar4 * 2;
  }
  if (cfg->dst_fmt == 3) {
    uVar14 = (iVar1 * iVar4 * 3) / 2;
  }
  else {
    if (cfg->dst_fmt != 2) goto LAB_00102bb9;
    uVar14 = iVar1 * iVar4 * 2;
  }
  if (piVar6 == (iep_com_ctx *)0x0) {
    _mpp_log_l(2,"iep2_test","Assertion %s failed at %s:%d\n",0,"iep2","iep2_test",0xdc);
    if ((DAT_0010e11b & 0x10) != 0) goto LAB_00102bb9;
  }
  iVar4 = mpp_buffer_group_get(&local_1d8,3,0,"iep2_test","iep2_test");
  if (iVar4 != 0) {
    _mpp_log_l(2,"iep2_test","memGroup mpp_buffer_group_get failed\n",0);
    _mpp_log_l(2,"iep2_test","Assertion %s failed at %s:%d\n",0,"0","iep2_test",0xe1);
    if ((DAT_0010e11b & 0x10) != 0) goto LAB_00102bb9;
  }
  sVar12 = (size_t)iVar11;
  sVar9 = (size_t)(int)uVar14;
  local_158.len = 0;
  local_158.sum_cnt = 0;
  local_158.sum = (RK_ULONG *)0x0;
  local_158.vor = 0;
  local_158._20_4_ = 0;
  local_138 = (ulong)uVar14;
  local_158.sum = (RK_ULONG *)mpp_osal_malloc("iep2_test",0x1000);
  mpp_buffer_get_with_tag(local_1d8,&local_1b8,sVar12,"iep2_test","iep2_test");
  mpp_buffer_get_with_tag(local_1d8,&iStack_1b0,sVar12,"iep2_test","iep2_test");
  local_168 = sVar12;
  mpp_buffer_get_with_tag(local_1d8,&local_1a8,sVar12,"iep2_test","iep2_test");
  mpp_buffer_get_with_tag(local_1d8,&local_1c8,sVar9,"iep2_test","iep2_test");
  local_160 = sVar9;
  uVar5 = mpp_buffer_get_with_tag(local_1d8,&local_1c0,sVar9,"iep2_test","iep2_test");
  auVar19._0_4_ = -(uint)(iStack_1b4 == 0 && local_1b8 == 0);
  auVar19._4_4_ = -(uint)(iStack_1b0 == 0 && iStack_1ac == 0);
  auVar19._8_4_ = -(uint)((int)((ulong)local_1a8 >> 0x20) == 0 && (int)local_1a8 == 0);
  auVar19._12_4_ = -(uint)((int)local_1c8 == 0 && (int)((ulong)local_1c8 >> 0x20) == 0);
  iVar4 = movmskps(uVar5,auVar19);
  if ((iVar4 != 0) || (local_1c0 == 0)) {
    _mpp_log_l(2,"iep2_test","Assertion %s failed at %s:%d\n",0,
               "srcbuf[0] && srcbuf[1] && srcbuf[2] && dstbuf[0] && dstbuf[1]","iep2_test",0xec);
    if ((DAT_0010e11b & 0x10) != 0) {
LAB_00102bb9:
      abort();
    }
  }
  __ptr = (void *)mpp_buffer_get_ptr_with_caller(CONCAT44(iStack_1b4,local_1b8),"iep2_test");
  local_118[0] = __ptr;
  __ptr_00 = (void *)mpp_buffer_get_ptr_with_caller(CONCAT44(iStack_1ac,iStack_1b0),"iep2_test");
  local_118[1] = __ptr_00;
  __ptr_01 = (void *)mpp_buffer_get_ptr_with_caller(local_1a8,"iep2_test");
  local_118[2] = __ptr_01;
  local_188[0] = (void *)mpp_buffer_get_ptr_with_caller(local_1c8,"iep2_test");
  local_128 = local_188[0];
  local_188[1] = (void *)mpp_buffer_get_ptr_with_caller(local_1c0,"iep2_test");
  local_130 = local_188[1];
  local_194[0] = mpp_buffer_get_fd_with_caller(CONCAT44(iStack_1b4,local_1b8),"iep2_test");
  local_194[1] = mpp_buffer_get_fd_with_caller(CONCAT44(iStack_1ac,iStack_1b0),"iep2_test");
  local_194[2] = mpp_buffer_get_fd_with_caller(local_1a8,"iep2_test");
  local_198 = mpp_buffer_get_fd_with_caller(local_1c8,"iep2_test");
  local_19c = mpp_buffer_get_fd_with_caller(local_1c0,"iep2_test");
  (*piVar6->ops->init)(&piVar6->priv);
  sVar9 = local_168;
  sVar12 = fread(__ptr,1,local_168,(FILE *)cfg->fp_src);
  if (sVar9 <= sVar12) {
    sVar12 = fread(__ptr_00,1,sVar9,(FILE *)cfg->fp_src);
    if (sVar9 <= sVar12) {
      local_50 = 1;
      uStack_4c = 1;
      uStack_48 = 0;
      uStack_44 = CONCAT44(uStack_44._4_4_,cfg->field_order);
      (*piVar6->ops->control)(piVar6->priv,IEP_CMD_SET_DEI_CFG,&local_50);
      local_50 = 0;
      uVar2 = cfg->src_fmt;
      uVar3 = cfg->src_swa;
      uStack_44._0_4_ = cfg->dst_fmt;
      uStack_44._4_4_ = cfg->dst_swa;
      local_3c._0_4_ = cfg->w;
      local_3c._4_4_ = cfg->h;
      local_1d0 = piVar6;
      uStack_4c = uVar2;
      uStack_48 = uVar3;
      local_34 = (undefined4)local_3c;
      (*piVar6->ops->control)(piVar6->priv,IEP_CMD_SET_DEI_CFG,&local_50);
      IStack_a8.format = cfg->src_fmt;
      local_e8.format = cfg->dst_fmt;
      local_cc.format = local_e8.format;
      local_80 = IStack_a8.format;
      local_64 = IStack_a8.format;
      sVar12 = fread(__ptr_01,1,sVar9,(FILE *)cfg->fp_src);
      if (sVar9 <= sVar12) {
        uVar15 = 1;
        uVar10 = 2;
        uVar17 = 2;
        uVar16 = 1;
        local_170 = 0;
        do {
          piVar6 = local_1d0;
          local_120 = uVar10;
          uVar14 = ((int)uVar16 - 1U) % 3;
          iep2_test_set_img(local_1d0,cfg->w,cfg->h,&IStack_a8 + uVar15,local_194[uVar15],
                            IEP_CMD_SET_SRC);
          iep2_test_set_img(piVar6,cfg->w,cfg->h,&IStack_a8 + uVar17,local_194[uVar17],
                            IEP_CMD_SET_DEI_SRC1);
          iep2_test_set_img(piVar6,cfg->w,cfg->h,&IStack_a8 + uVar14,local_194[uVar14],
                            IEP_CMD_SET_DEI_SRC2);
          iep2_test_set_img(piVar6,cfg->w,cfg->h,&local_e8,local_198,IEP_CMD_SET_DST);
          iep2_test_set_img(piVar6,cfg->w,cfg->h,&local_cc,local_19c,IEP_CMD_SET_DEI_DST1);
          sVar9 = local_160;
          memset(local_128,0,local_160);
          memset(local_130,0,sVar9);
          (*piVar6->ops->control)(piVar6->priv,IEP_CMD_RUN_SYNC,local_fc);
          if (cfg->fp_slt != (FILE *)0x0) {
            uVar14 = (uint)local_170;
            len = (RK_U32)local_138;
            calc_data_crc((RK_U8 *)local_188[local_170 & 0xffffffff],len,&local_158);
            write_data_crc(cfg->fp_slt,&local_158);
            calc_data_crc((RK_U8 *)local_188[uVar14 ^ 1],len,&local_158);
            write_data_crc(cfg->fp_slt,&local_158);
          }
          iVar4 = local_fc[0];
          sVar12 = local_160;
          sVar9 = local_168;
          bVar18 = local_fc[0] == 1;
          if ((FILE *)cfg->fp_dst != (FILE *)0x0) {
            sVar7 = fwrite(local_188[local_fc[0] == 1],1,local_160,(FILE *)cfg->fp_dst);
            if (sVar12 <= sVar7) {
              sVar7 = fwrite(local_188[iVar4 != 1],1,sVar12,(FILE *)cfg->fp_dst);
              if (sVar12 <= sVar7) goto LAB_00102a6f;
            }
            pcVar8 = "destination dump failed\n";
            uVar13 = 2;
            goto LAB_00102b01;
          }
LAB_00102a6f:
          uVar16 = local_120;
          local_170 = (ulong)bVar18;
          iVar4 = (int)((local_120 & 0xffffffff) / 3);
          uVar15 = (ulong)(uint)((int)local_120 + iVar4 * -3);
          uVar14 = (int)local_120 + iVar4 * -3 + 1;
          uVar10 = (ulong)uVar14;
          if (uVar14 == 3) {
            uVar14 = 0;
          }
          uVar17 = (ulong)uVar14;
          sVar12 = fread(local_118[uVar17],1,sVar9,(FILE *)cfg->fp_src);
        } while (sVar9 <= sVar12);
      }
      pcVar8 = "source exhaused\n";
      uVar13 = 4;
LAB_00102b01:
      _mpp_log_l(uVar13,"iep2_test",pcVar8,0);
      piVar6 = local_1d0;
      goto LAB_00102b0f;
    }
  }
  _mpp_log_l(4,"iep2_test","source exhaused\n",0);
LAB_00102b0f:
  mpp_buffer_put_with_caller(CONCAT44(iStack_1b4,local_1b8),"iep2_test");
  mpp_buffer_put_with_caller(CONCAT44(iStack_1ac,iStack_1b0),"iep2_test");
  mpp_buffer_put_with_caller(local_1a8,"iep2_test");
  mpp_buffer_put_with_caller(local_1c8,"iep2_test");
  mpp_buffer_put_with_caller(local_1c0,"iep2_test");
  if (local_158.sum != (RK_ULONG *)0x0) {
    mpp_osal_free("iep2_test");
  }
  local_158.sum = (RK_ULONG *)0x0;
  if (local_1d8 != 0) {
    mpp_buffer_group_put();
    local_1d8 = 0;
  }
  (*piVar6->ops->deinit)(piVar6->priv);
  rockchip_iep2_api_release_ctx(piVar6);
  return;
}

Assistant:

void iep2_test(iep2_test_cfg *cfg)
{
    iep_com_ctx* iep2 = rockchip_iep2_api_alloc_ctx();
    size_t srcfrmsize = get_frm_size(cfg->src_fmt, cfg->w, cfg->h);
    size_t dstfrmsize = get_frm_size(cfg->dst_fmt, cfg->w, cfg->h);
    MppBuffer srcbuf[3];
    MppBuffer dstbuf[2];
    RK_U8 *psrc[3];
    RK_U8 *pdst[2];
    RK_S32 fdsrc[3];
    RK_S32 fddst[2];
    int prev, curr, next;
    struct iep2_api_params params;
    RK_U32 i;
    RK_S32 field_order = IEP2_FIELD_ORDER_TFF;
    RK_S32 out_order = field_order == IEP2_FIELD_ORDER_TFF ? 0 : 1;
    DataCrc checkcrc;
    struct iep2_api_info dei_info;

    // NOTISE, used IepImg structure for version compatibility consideration,
    // only addresses in this structure are useful in iep2
    IepImg imgsrc[3];
    IepImg imgdst[2];

    mpp_assert(iep2);
    MppBufferGroup memGroup;
    MPP_RET ret = mpp_buffer_group_get_internal(&memGroup, MPP_BUFFER_TYPE_DRM);
    if (MPP_OK != ret) {
        mpp_err("memGroup mpp_buffer_group_get failed\n");
        mpp_assert(0);
    }

    memset(&checkcrc, 0, sizeof(checkcrc));
    checkcrc.sum = mpp_malloc(RK_ULONG, 512);

    mpp_buffer_get(memGroup, &srcbuf[0], srcfrmsize);
    mpp_buffer_get(memGroup, &srcbuf[1], srcfrmsize);
    mpp_buffer_get(memGroup, &srcbuf[2], srcfrmsize);
    mpp_buffer_get(memGroup, &dstbuf[0], dstfrmsize);
    mpp_buffer_get(memGroup, &dstbuf[1], dstfrmsize);
    mpp_assert(srcbuf[0] && srcbuf[1] && srcbuf[2] && dstbuf[0] && dstbuf[1]);

    psrc[0] = mpp_buffer_get_ptr(srcbuf[0]);
    psrc[1] = mpp_buffer_get_ptr(srcbuf[1]);
    psrc[2] = mpp_buffer_get_ptr(srcbuf[2]);

    pdst[0] = mpp_buffer_get_ptr(dstbuf[0]);
    pdst[1] = mpp_buffer_get_ptr(dstbuf[1]);

    fdsrc[0] = mpp_buffer_get_fd(srcbuf[0]);
    fdsrc[1] = mpp_buffer_get_fd(srcbuf[1]);
    fdsrc[2] = mpp_buffer_get_fd(srcbuf[2]);

    fddst[0] = mpp_buffer_get_fd(dstbuf[0]);
    fddst[1] = mpp_buffer_get_fd(dstbuf[1]);

    iep2->ops->init(&iep2->priv);

    if (srcfrmsize > fread(psrc[0], 1, srcfrmsize, cfg->fp_src)) {
        mpp_log("source exhaused\n");
        goto ret;
    }

    if (srcfrmsize > fread(psrc[1], 1, srcfrmsize, cfg->fp_src)) {
        mpp_log("source exhaused\n");
        goto ret;
    }

    curr = 1;

    // set running mode.
    /* if deinterlacing mode is one in the following list:
        IEP2_DIL_MODE_I5O2,
        IEP2_DIL_MODE_I5O1T,
        IEP2_DIL_MODE_I5O1B,
        IEP2_DIL_MODE_DECT
       field order will auto detect by iep2 library.
       so don't try to set field order during the playback.
    */
    params.ptype = IEP2_PARAM_TYPE_MODE;
    params.param.mode.dil_mode = IEP2_DIL_MODE_I5O2;
    params.param.mode.out_mode = IEP2_OUT_MODE_LINE;
    params.param.mode.dil_order = cfg->field_order;

    iep2->ops->control(iep2->priv, IEP_CMD_SET_DEI_CFG, &params);

    // set the image format.
    params.ptype = IEP2_PARAM_TYPE_COM;
    params.param.com.sfmt = cfg->src_fmt;
    params.param.com.dfmt = cfg->dst_fmt;
    params.param.com.sswap = cfg->src_swa;
    params.param.com.dswap = cfg->dst_swa;
    params.param.com.width = cfg->w;
    params.param.com.height = cfg->h;
    params.param.com.hor_stride = cfg->w;
    iep2->ops->control(iep2->priv, IEP_CMD_SET_DEI_CFG, &params);

    for (i = 0; i < MPP_ARRAY_ELEMS(imgsrc); i++)
        imgsrc[i].format = cfg->src_fmt;

    for (i = 0; i < MPP_ARRAY_ELEMS(imgdst); i++)
        imgdst[i].format = cfg->dst_fmt;

    while (1) {
        prev = (curr - 1) % 3;
        curr = curr % 3;
        next = (curr + 1) % 3;

        if (srcfrmsize > fread(psrc[next], 1, srcfrmsize, cfg->fp_src)) {
            mpp_log("source exhaused\n");
            break;
        }

        // notice the order of the input frames.
        iep2_test_set_img(iep2, cfg->w, cfg->h,
                          &imgsrc[curr], fdsrc[curr], IEP_CMD_SET_SRC);
        iep2_test_set_img(iep2, cfg->w, cfg->h,
                          &imgsrc[next], fdsrc[next], IEP_CMD_SET_DEI_SRC1);
        iep2_test_set_img(iep2, cfg->w, cfg->h,
                          &imgsrc[prev], fdsrc[prev], IEP_CMD_SET_DEI_SRC2);
        iep2_test_set_img(iep2, cfg->w, cfg->h,
                          &imgdst[0], fddst[0], IEP_CMD_SET_DST);
        iep2_test_set_img(iep2, cfg->w, cfg->h,
                          &imgdst[1], fddst[1], IEP_CMD_SET_DEI_DST1);

        memset(pdst[0], 0, dstfrmsize);
        memset(pdst[1], 0, dstfrmsize);
        iep2->ops->control(iep2->priv, IEP_CMD_RUN_SYNC, &dei_info);

        if (cfg->fp_slt) {
            calc_data_crc(pdst[out_order], dstfrmsize, &checkcrc);
            write_data_crc(cfg->fp_slt, &checkcrc);
            calc_data_crc(pdst[1 - out_order], dstfrmsize, &checkcrc);
            write_data_crc(cfg->fp_slt, &checkcrc);
        }

        out_order = dei_info.dil_order == IEP2_FIELD_ORDER_BFF ? 1 : 0;

        if (cfg->fp_dst) {
            if (dstfrmsize > fwrite(pdst[out_order], 1, dstfrmsize, cfg->fp_dst)) {
                mpp_err("destination dump failed\n");
                break;
            }

            if (dstfrmsize > fwrite(pdst[1 - out_order], 1, dstfrmsize, cfg->fp_dst)) {
                mpp_err("destination dump failed\n");
                break;
            }
        }

        curr++;
    }

ret:
    mpp_buffer_put(srcbuf[0]);
    mpp_buffer_put(srcbuf[1]);
    mpp_buffer_put(srcbuf[2]);

    mpp_buffer_put(dstbuf[0]);
    mpp_buffer_put(dstbuf[1]);

    MPP_FREE(checkcrc.sum);

    if (memGroup) {
        mpp_buffer_group_put(memGroup);
        memGroup = NULL;
    }

    iep2->ops->deinit(iep2->priv);

    rockchip_iep2_api_release_ctx(iep2);
}